

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenBlockSetName(BinaryenExpressionRef expr,char *name)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id == BlockId) {
    this = (IString *)strlen(name);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)name;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 1) = sVar1;
    return;
  }
  __assert_fail("expression->is<Block>()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x7e1,"void BinaryenBlockSetName(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenBlockSetName(BinaryenExpressionRef expr, const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Block>());
  // may be null or empty
  static_cast<Block*>(expression)->name = name;
}